

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O2

void __thiscall
Pl_DCT::Pl_DCT(Pl_DCT *this,char *identifier,Pipeline *next,JDIMENSION image_width,
              JDIMENSION image_height,int components,J_COLOR_SPACE color_space,
              CompressConfig *compress_callback)

{
  J_COLOR_SPACE local_2c;
  JDIMENSION local_28;
  JDIMENSION local_24;
  
  local_2c = components;
  local_28 = image_height;
  local_24 = image_width;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_DCT_002ac380;
  std::
  make_unique<Pl_DCT::Members,unsigned_int&,unsigned_int&,int&,J_COLOR_SPACE&,Pl_DCT::CompressConfig*&>
            ((uint *)&this->m,&local_24,(int *)&local_28,&local_2c,(CompressConfig **)&color_space);
  return;
}

Assistant:

Pl_DCT::Pl_DCT(
    char const* identifier,
    Pipeline* next,
    JDIMENSION image_width,
    JDIMENSION image_height,
    int components,
    J_COLOR_SPACE color_space,
    CompressConfig* compress_callback) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(
        image_width, image_height, components, color_space, compress_callback))
{
}